

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void LD4_C(uint8_t *dst)

{
  byte bVar1;
  undefined4 uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  ulong uVar6;
  undefined7 uVar7;
  uint3 uVar8;
  uint7 uVar9;
  ushort uVar10;
  uint8_t uVar11;
  ushort uVar12;
  ushort uVar13;
  byte bVar16;
  ushort uVar14;
  ushort uVar15;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  undefined1 auVar21 [16];
  
  bVar1 = dst[-0x1a];
  uVar2 = *(undefined4 *)(dst + -0x1e);
  bVar16 = (byte)((uint)uVar2 >> 0x18);
  uVar7 = CONCAT25((short)(((uint7)bVar16 << 0x30) >> 0x28),
                   CONCAT14((char)((uint)uVar2 >> 0x10),uVar2));
  uVar8 = (uint3)((uint7)uVar7 >> 0x20);
  uVar9 = (uint7)CONCAT41((int)(CONCAT34(uVar8,uVar2) >> 0x18),(char)((uint)uVar2 >> 8)) &
          0xffffff00ff;
  uVar12 = (ushort)(byte)uVar2;
  uVar10 = (ushort)dst[-0x19];
  *dst = (uint8_t)((uint)dst[-0x20] + (uint)uVar12 + (uint)dst[-0x1f] * 2 + 2 >> 2);
  uVar13 = (ushort)uVar9;
  uVar11 = (uint8_t)((uint)uVar13 + (uint)dst[-0x1f] + (uint)uVar12 * 2 + 2 >> 2);
  dst[0x20] = uVar11;
  uVar6 = (ulong)CONCAT52((int5)uVar9,uVar12) & 0xffffffffffff0000;
  auVar21._2_2_ = (short)(uVar6 >> 0x10) * 2;
  auVar21._0_2_ = (ushort)bVar1 * 2;
  auVar21._4_2_ = (short)(uVar6 >> 0x20) * 2;
  auVar21._6_2_ = (short)(uVar6 >> 0x30) * 2;
  auVar21._8_8_ = 0;
  auVar21 = pshuflw(auVar21,auVar21,0x39);
  dst[1] = uVar11;
  uVar6 = (ulong)CONCAT34(uVar8,(uint)uVar8) & 0xffffffff;
  uVar12 = (ushort)((short)uVar6 + auVar21._0_2_ + uVar12 + 2) >> 2;
  uVar14 = (ushort)((short)(uVar6 >> 0x10) + auVar21._2_2_ + uVar13 + 2) >> 2;
  uVar17 = (ushort)((ushort)bVar1 + auVar21._4_2_ + (short)((uint7)uVar7 >> 0x20) + 2) >> 2;
  uVar19 = (ushort)(uVar10 + auVar21._6_2_ + (ushort)bVar16 + 2) >> 2;
  uVar13 = uVar12 & 0xff;
  uVar15 = uVar14 & 0xff;
  uVar18 = uVar17 & 0xff;
  uVar20 = uVar19 & 0xff;
  uVar11 = (uint8_t)uVar12;
  uVar3 = (uint8_t)uVar14;
  uVar4 = (uint8_t)uVar17;
  uVar5 = (uint8_t)uVar19;
  dst[0x21] = uVar11;
  dst[2] = uVar11;
  dst[0x60] = uVar3;
  dst[0x22] = uVar3;
  dst[3] = uVar3;
  dst[0x61] = uVar4;
  dst[0x23] = uVar4;
  dst[0x62] = uVar5;
  *(uint *)(dst + 0x40) =
       CONCAT13((uVar20 != 0) * (uVar20 < 0x100) * uVar5 - (0xff < uVar20),
                CONCAT12((uVar18 != 0) * (uVar18 < 0x100) * uVar4 - (0xff < uVar18),
                         CONCAT11((uVar15 != 0) * (uVar15 < 0x100) * uVar3 - (0xff < uVar15),
                                  (uVar13 != 0) * (uVar13 < 0x100) * uVar11 - (0xff < uVar13))));
  dst[99] = (uint8_t)((uint)bVar1 + (uint)uVar10 + (uint)uVar10 * 2 + 2 >> 2);
  return;
}

Assistant:

static void LD4_C(uint8_t* dst) {   // Down-Left
  const int A = dst[0 - BPS];
  const int B = dst[1 - BPS];
  const int C = dst[2 - BPS];
  const int D = dst[3 - BPS];
  const int E = dst[4 - BPS];
  const int F = dst[5 - BPS];
  const int G = dst[6 - BPS];
  const int H = dst[7 - BPS];
  DST(0, 0)                                     = AVG3(A, B, C);
  DST(1, 0) = DST(0, 1)                         = AVG3(B, C, D);
  DST(2, 0) = DST(1, 1) = DST(0, 2)             = AVG3(C, D, E);
  DST(3, 0) = DST(2, 1) = DST(1, 2) = DST(0, 3) = AVG3(D, E, F);
              DST(3, 1) = DST(2, 2) = DST(1, 3) = AVG3(E, F, G);
                          DST(3, 2) = DST(2, 3) = AVG3(F, G, H);
                                      DST(3, 3) = AVG3(G, H, H);
}